

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers.h
# Opt level: O0

Type __thiscall QtPromise::resolve<QFuture<void>>(QtPromise *this,QFuture<void> *value)

{
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> extraout_RDX;
  Type TVar1;
  anon_class_8_1_a8c68091 local_20;
  QFuture<void> *local_18;
  QFuture<void> *value_local;
  
  local_20.value = value;
  local_18 = value;
  value_local = (QFuture<void> *)this;
  QPromise<void>::
  QPromise<QtPromise::resolve<QFuture<void>>(QFuture<void>&&)::_lambda(QtPromise::QPromiseResolve<void>&&,QtPromise::QPromiseReject<void>&&)_1_>
            ((QPromise<void> *)this,&local_20);
  TVar1.super_QPromiseBase<void>.m_d.d = extraout_RDX.d;
  TVar1.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)this;
  return (Type)TVar1.super_QPromiseBase<void>;
}

Assistant:

static inline typename QtPromisePrivate::PromiseDeduce<T>::Type resolve(T&& value)
{
    using namespace QtPromisePrivate;
    using PromiseType = typename PromiseDeduce<T>::Type;
    using ValueType = typename PromiseType::Type;
    using ResolveType = QPromiseResolve<ValueType>;
    using RejectType = QPromiseReject<ValueType>;

    return PromiseType{[&](ResolveType&& resolve, RejectType&& reject) {
        PromiseFulfill<Unqualified<T>>::call(std::forward<T>(value),
                                             std::forward<ResolveType>(resolve),
                                             std::forward<RejectType>(reject));
    }};
}